

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexBoxFilter::buildKernel
          (PtexBoxFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,Res faceRes)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined4 in_XMM2_Db;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float __x;
  undefined1 auVar18 [16];
  anon_union_4_2_f9ecf184 anon_var_0;
  float fVar19;
  undefined1 auVar20 [16];
  float __x_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  undefined1 auVar17 [16];
  
  auVar15._4_12_ = in_register_000012c4;
  auVar15._0_4_ = vw;
  auVar14._0_8_ = auVar15._0_8_;
  auVar14._8_4_ = in_register_000012c4._0_4_;
  auVar14._12_4_ = in_XMM2_Db;
  auVar21._8_8_ = auVar14._8_8_;
  auVar21._4_4_ = uw;
  auVar21._0_4_ = vw;
  auVar15 = minps(auVar21,_DAT_02817be0);
  auVar12._0_4_ = (float)(0x3f800000 - ((int)((uint)(byte)faceRes.vlog2 << 0x18) >> 1));
  auVar12._4_4_ = (float)(0x3f800000 - ((int)((uint)(ushort)faceRes << 0x18) >> 1));
  auVar12._8_8_ = 0;
  fVar19 = auVar15._4_4_;
  iVar5 = -(uint)(auVar12._0_4_ < auVar15._0_4_);
  iVar6 = -(uint)(auVar12._4_4_ < fVar19);
  auVar18._4_4_ = iVar6;
  auVar18._0_4_ = iVar5;
  auVar18._8_4_ = iVar6;
  auVar18._12_4_ = iVar6;
  auVar17._8_8_ = auVar18._8_8_;
  auVar17._4_4_ = iVar5;
  auVar17._0_4_ = iVar5;
  uVar2 = movmskpd((uint)(byte)faceRes.vlog2,auVar17);
  if ((uVar2 & 2) == 0) {
    fVar19 = auVar12._4_4_;
  }
  if ((uVar2 & 1) == 0) {
    auVar15 = auVar12;
  }
  iVar5 = (0x7f - ((uint)fVar19 >> 0x17) & 0xff) - ((uint)auVar15._0_4_ >> 0xf & 0x1ff00);
  k->res = (Res)((short)iVar5 + 0x7f00);
  fVar11 = (float)(1 << ((byte)iVar5 & 0x1f));
  fVar16 = (float)(1 << ((k->res).vlog2 & 0x1fU));
  fVar7 = u * fVar11;
  fVar10 = v * fVar16;
  fVar19 = fVar19 * fVar11;
  fVar16 = auVar15._0_4_ * fVar16;
  __x = fVar19 * -0.5 + fVar7;
  fVar7 = fVar19 * 0.5 + fVar7;
  __x_00 = fVar16 * -0.5 + fVar10;
  fVar10 = fVar16 * 0.5 + fVar10;
  fVar19 = floorf(__x);
  fVar11 = ceilf(fVar7);
  fVar16 = floorf(__x_00);
  fVar8 = ceilf(fVar10);
  k->u = (int)fVar19;
  k->v = (int)fVar16;
  iVar6 = (int)fVar11 - (int)fVar19;
  k->uw = iVar6;
  iVar5 = (int)fVar8 - (int)fVar16;
  k->vw = iVar5;
  pfVar1 = k->ku;
  fVar19 = (fVar19 - __x) + 1.0;
  fVar7 = (fVar7 - fVar11) + 1.0;
  if (iVar6 == 1) {
    *pfVar1 = fVar19 + fVar7 + -1.0;
  }
  else {
    *pfVar1 = fVar19;
    auVar14 = _DAT_02cc11f0;
    auVar12 = _DAT_02cc11e0;
    auVar15 = _DAT_003fd860;
    uVar2 = iVar6 - 1;
    if (2 < iVar6) {
      lVar3 = (ulong)uVar2 - 2;
      auVar13._8_4_ = (int)lVar3;
      auVar13._0_8_ = lVar3;
      auVar13._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar13 = auVar13 ^ _DAT_02cc11f0;
      do {
        auVar22._8_4_ = (int)uVar4;
        auVar22._0_8_ = uVar4;
        auVar22._12_4_ = (int)(uVar4 >> 0x20);
        auVar21 = (auVar22 | auVar15) ^ auVar14;
        iVar6 = auVar13._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar6 && auVar13._0_4_ < auVar21._0_4_ ||
                    iVar6 < auVar21._4_4_) & 1)) {
          pfVar1[uVar4 + 1] = 1.0;
        }
        if ((auVar21._12_4_ != auVar13._12_4_ || auVar21._8_4_ <= auVar13._8_4_) &&
            auVar21._12_4_ <= auVar13._12_4_) {
          pfVar1[uVar4 + 2] = 1.0;
        }
        auVar21 = (auVar22 | auVar12) ^ auVar14;
        iVar23 = auVar21._4_4_;
        if (iVar23 <= iVar6 && (iVar23 != iVar6 || auVar21._0_4_ <= auVar13._0_4_)) {
          pfVar1[uVar4 + 3] = 1.0;
          pfVar1[uVar4 + 4] = 1.0;
        }
        uVar4 = uVar4 + 4;
      } while (((ulong)uVar2 + 2 & 0xfffffffffffffffc) != uVar4);
    }
    pfVar1[(int)uVar2] = fVar7;
  }
  pfVar1 = k->kv;
  fVar7 = (fVar16 - __x_00) + 1.0;
  fVar19 = (fVar10 - fVar8) + 1.0;
  if (iVar5 == 1) {
    *pfVar1 = fVar7 + fVar19 + -1.0;
  }
  else {
    *pfVar1 = fVar7;
    auVar14 = _DAT_02cc11f0;
    auVar12 = _DAT_02cc11e0;
    auVar15 = _DAT_003fd860;
    uVar2 = iVar5 - 1;
    if (2 < iVar5) {
      lVar3 = (ulong)uVar2 - 2;
      auVar9._8_4_ = (int)lVar3;
      auVar9._0_8_ = lVar3;
      auVar9._12_4_ = (int)((ulong)lVar3 >> 0x20);
      uVar4 = 0;
      auVar9 = auVar9 ^ _DAT_02cc11f0;
      do {
        auVar20._8_4_ = (int)uVar4;
        auVar20._0_8_ = uVar4;
        auVar20._12_4_ = (int)(uVar4 >> 0x20);
        auVar21 = (auVar20 | auVar15) ^ auVar14;
        iVar5 = auVar9._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar5 && auVar9._0_4_ < auVar21._0_4_ || iVar5 < auVar21._4_4_
                    ) & 1)) {
          pfVar1[uVar4 + 1] = 1.0;
        }
        if ((auVar21._12_4_ != auVar9._12_4_ || auVar21._8_4_ <= auVar9._8_4_) &&
            auVar21._12_4_ <= auVar9._12_4_) {
          pfVar1[uVar4 + 2] = 1.0;
        }
        auVar21 = (auVar20 | auVar12) ^ auVar14;
        iVar6 = auVar21._4_4_;
        if (iVar6 <= iVar5 && (iVar6 != iVar5 || auVar21._0_4_ <= auVar9._0_4_)) {
          pfVar1[uVar4 + 3] = 1.0;
          pfVar1[uVar4 + 4] = 1.0;
        }
        uVar4 = uVar4 + 4;
      } while (((ulong)uVar2 + 2 & 0xfffffffffffffffc) != uVar4);
    }
    pfVar1[(int)uVar2] = fVar19;
  }
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        // compute desired texture res based on filter width
        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        u = u * (float)k.res.u();
        v = v * (float)k.res.v();
        uw *= (float)k.res.u();
        vw *= (float)k.res.v();

        // find integer pixel extent: [u,v] +/- [uw/2,vw/2]
        // (box is 1 unit wide for a 1 unit filter period)
        float u1 = u - 0.5f*uw, u2 = u + 0.5f*uw;
        float v1 = v - 0.5f*vw, v2 = v + 0.5f*vw;
        float u1floor = PtexUtils::floor(u1), u2ceil = PtexUtils::ceil(u2);
        float v1floor = PtexUtils::floor(v1), v2ceil = PtexUtils::ceil(v2);
        k.u = int(u1floor);
        k.v = int(v1floor);
        k.uw = int(u2ceil)-k.u;
        k.vw = int(v2ceil)-k.v;

        // compute kernel weights along u and v directions
        computeWeights(k.ku, k.uw, 1.0f-(u1-u1floor), 1.0f-(u2ceil-u2));
        computeWeights(k.kv, k.vw, 1.0f-(v1-v1floor), 1.0f-(v2ceil-v2));
    }